

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O2

void findLeakageFlows(double lamda,double *dH,double *xQ,Network *nw)

{
  pointer ppLVar1;
  Link *pLVar2;
  Node *pNVar3;
  Node *pNVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer ppLVar8;
  ulong uVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_40;
  long local_38;
  
  ppLVar1 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar8 = (nw->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar8 != ppLVar1; ppLVar8 = ppLVar8 + 1) {
    pLVar2 = *ppLVar8;
    pLVar2->leakage = 0.0;
    local_40 = 0.0;
    iVar5 = (*(pLVar2->super_Element)._vptr_Element[0x14])(pLVar2);
    if ((char)iVar5 != '\0') {
      pNVar3 = pLVar2->fromNode;
      pNVar4 = pLVar2->toNode;
      local_38 = (long)(pNVar3->super_Element).index;
      iVar5 = (pNVar4->super_Element).index;
      iVar6 = (*(pNVar3->super_Element)._vptr_Element[2])(pNVar3);
      iVar7 = (*(pNVar4->super_Element)._vptr_Element[2])(pNVar4);
      if (iVar6 == 0 || iVar7 == 0) {
        dVar13 = (dH[local_38] * lamda + pNVar3->head) - pNVar3->elev;
        dVar11 = (dH[iVar5] * lamda + pNVar4->head) - pNVar4->elev;
        if (0.0 < (dVar13 + dVar11) * 0.5) {
          (*(pLVar2->super_Element)._vptr_Element[0x15])(pLVar2,nw,&local_40);
          dVar12 = extraout_XMM0_Qa * 0.5;
          dVar10 = dVar12 + dVar12;
          if (iVar7 == 0 && iVar6 == 0) {
            uVar9 = -(ulong)(0.0 < dVar13 * dVar11);
            dVar10 = (double)(~uVar9 & (ulong)dVar10 | (ulong)dVar12 & uVar9);
          }
          pLVar2->leakage = extraout_XMM0_Qa;
          if ((iVar6 == 0) && (0.0 < dVar13)) {
            pNVar3->outflow = pNVar3->outflow + dVar10;
            pNVar3->qGrad = local_40 + pNVar3->qGrad;
            xQ[local_38] = xQ[local_38] - dVar10;
          }
          if ((iVar7 == 0) && (0.0 < dVar11)) {
            pNVar4->outflow = pNVar4->outflow + dVar10;
            pNVar4->qGrad = local_40 + pNVar4->qGrad;
            xQ[iVar5] = xQ[iVar5] - dVar10;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void findLeakageFlows(double lamda, double dH[], double xQ[], Network* nw)
{
    double dqdh = 0.0;  // gradient of leakage outflow w.r.t. pressure head

    for (Link* link : nw->links)
    {
        // ... skip links that don't leak

        link->leakage = 0.0;
        dqdh = 0.0;
        if ( !link->canLeak() ) continue;

        // ... identify link's end nodes and their indexes

        Node* node1 = link->fromNode;
        Node* node2 = link->toNode;
        int n1 = node1->index;
        int n2 = node2->index;

        // ... no leakage if neither end node is not a junction

        bool canLeak1 = (node1->type() == Node::JUNCTION);
        bool canLeak2 = (node2->type() == Node::JUNCTION);
        if ( !canLeak1 && !canLeak2 ) continue;

        // ... find link's average pressure head

        double h1 = node1->head + lamda * dH[n1] - node1->elev;
        double h2 = node2->head + lamda * dH[n2] - node2->elev;
        double h = (h1 + h2) / 2.0;
        if ( h <= 0.0 ) continue;

        // ... find leakage and its gradient

        link->leakage = link->findLeakage(nw, h, dqdh);

        // ... split leakage flow between end nodes, unless one cannot
        //     support leakage or has negative pressure head

        double q = link->leakage / 2.0;
        if ( h1 * h2 <= 0.0 || canLeak1 * canLeak2 == 0 ) q = 2.0 * q;

        // ... add leakage to each node's outflow

        if ( h1 > 0.0 && canLeak1 )
        {
            node1->outflow += q;
            node1->qGrad += dqdh;
            xQ[n1] -= q;
        }
        if ( h2 > 0.0 && canLeak2 )
        {
            node2->outflow += q;
            node2->qGrad += dqdh;
            xQ[n2] -= q;
        }
    }
}